

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

void avro::compileJsonSchema(istream *is,ValidSchema *schema)

{
  Exception *this;
  InputStream *local_40;
  string local_38;
  
  if (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    istreamInputStream((avro *)&local_40,is,0x2000);
    compileJsonSchemaFromStream((avro *)&local_38,local_40);
    if (local_40 != (InputStream *)0x0) {
      (*local_40->_vptr_InputStream[1])();
    }
    boost::shared_ptr<avro::Node>::operator=(&schema->root_,(shared_ptr<avro::Node> *)&local_38);
    boost::detail::shared_count::~shared_count((shared_count *)&local_38._M_string_length);
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Input stream is not good",(allocator<char> *)&local_40);
  Exception::Exception(this,&local_38);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

AVRO_DECL void compileJsonSchema(std::istream &is, ValidSchema &schema)
{
    if (!is.good()) {
        throw Exception("Input stream is not good");
    }

    schema = compile(is);
}